

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O0

void check_openssl(int status)

{
  ulong e;
  runtime_error *this;
  allocator<char> local_139;
  string local_138 [8];
  string what;
  char buf [256];
  int status_local;
  
  if (status != 1) {
    what.field_2._8_8_ = 0;
    e = ERR_get_error();
    ERR_error_string_n(e,what.field_2._M_local_buf + 8,0x100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_138,"OpenSSL error: ",&local_139);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::operator+=(local_138,what.field_2._M_local_buf + 8);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,local_138);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ERR_clear_error();
  return;
}

Assistant:

static void
check_openssl(int status)
{
    if (status != 1) {
        // OpenSSL creates a "queue" of errors; copy the first (innermost) error to the exception
        // message.
        char buf[256] = "";
        ERR_error_string_n(ERR_get_error(), buf, sizeof(buf));
        std::string what = "OpenSSL error: ";
        what += buf;
        throw std::runtime_error(what);
    }
    ERR_clear_error();
}